

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_imports(lys_module *module,unres_schema *unres)

{
  byte size;
  byte size_00;
  lys_import *imp_00;
  lys_include *inc_00;
  lys_module *value;
  lys_submodule *value_00;
  int iVar1;
  lys_import *plVar2;
  LY_ERR *pLVar3;
  lys_include *plVar4;
  char *s;
  uint8_t i;
  uint8_t j;
  uint8_t inc_size;
  uint8_t imp_size;
  lys_include *inc;
  lys_import *imp;
  unres_schema *unres_local;
  lys_module *module_local;
  
  s._5_1_ = '\0';
  s._4_1_ = 0;
  imp_00 = module->imp;
  size = module->imp_size;
  inc_00 = module->inc;
  size_00 = module->inc_size;
  if (size == 0) {
LAB_00173ee1:
    if (size_00 != 0) {
      plVar4 = (lys_include *)calloc((ulong)size_00,0x30);
      module->inc = plVar4;
      module->inc_size = '\0';
      if (module->inc == (lys_include *)0x0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_check_imports");
        goto LAB_00174068;
      }
    }
    for (s._4_1_ = 0; s._4_1_ < size; s._4_1_ = s._4_1_ + 1) {
      value = imp_00[s._4_1_].module;
      imp_00[s._4_1_].module = (lys_module *)0x0;
      iVar1 = yang_fill_import(module,imp_00 + s._4_1_,module->imp + module->imp_size,(char *)value,
                               unres);
      if (iVar1 != 0) {
        s._4_1_ = s._4_1_ + 1;
        goto LAB_00174068;
      }
    }
    for (s._5_1_ = 0; s._5_1_ < size_00; s._5_1_ = s._5_1_ + 1) {
      value_00 = inc_00[s._5_1_].submodule;
      inc_00[s._5_1_].submodule = (lys_submodule *)0x0;
      iVar1 = yang_fill_include(module,(char *)value_00,inc_00 + s._5_1_,unres);
      if (iVar1 != 0) {
        s._5_1_ = s._5_1_ + 1;
        goto LAB_00174068;
      }
    }
    free(inc_00);
    free(imp_00);
    module_local._4_4_ = 0;
  }
  else {
    plVar2 = (lys_import *)calloc((ulong)size,0x38);
    module->imp = plVar2;
    module->imp_size = '\0';
    if (module->imp != (lys_import *)0x0) goto LAB_00173ee1;
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_check_imports");
LAB_00174068:
    yang_free_import(module->ctx,imp_00,s._4_1_,size);
    yang_free_include(module->ctx,inc_00,s._5_1_,size_00);
    free(imp_00);
    free(inc_00);
    module_local._4_4_ = 1;
  }
  return module_local._4_4_;
}

Assistant:

int
yang_check_imports(struct lys_module *module, struct unres_schema *unres)
{
    struct lys_import *imp;
    struct lys_include *inc;
    uint8_t imp_size, inc_size, j = 0, i = 0;
    char *s;

    imp = module->imp;
    imp_size = module->imp_size;
    inc = module->inc;
    inc_size = module->inc_size;

    if (imp_size) {
        module->imp = calloc(imp_size, sizeof *module->imp);
        module->imp_size = 0;
        if (!module->imp) {
            LOGMEM;
            goto error;
        }
    }

    if (inc_size) {
        module->inc = calloc(inc_size, sizeof *module->inc);
        module->inc_size = 0;
        if (!module->inc) {
            LOGMEM;
            goto error;
        }
    }

    for (i = 0; i < imp_size; ++i) {
        s = (char *) imp[i].module;
        imp[i].module = NULL;
        if (yang_fill_import(module, &imp[i], &module->imp[module->imp_size], s, unres)) {
            ++i;
            goto error;
        }
    }
    for (j = 0; j < inc_size; ++j) {
        s = (char *) inc[j].submodule;
        inc[j].submodule = NULL;
        if (yang_fill_include(module, s, &inc[j], unres)) {
            ++j;
            goto error;
        }
    }
    free(inc);
    free(imp);

    return EXIT_SUCCESS;

error:
    yang_free_import(module->ctx, imp, i, imp_size);
    yang_free_include(module->ctx, inc, j, inc_size);
    free(imp);
    free(inc);
    return EXIT_FAILURE;
}